

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SuttonChenAdapter.cpp
# Opt level: O2

SCAtypeParameters * __thiscall
OpenMD::SuttonChenAdapter::getSuttonChenParam
          (SCAtypeParameters *__return_storage_ptr__,SuttonChenAdapter *this)

{
  _func_int **pp_Var1;
  pointer pcVar2;
  RealType RVar3;
  bool bVar4;
  shared_ptr<OpenMD::SimpleTypeData<OpenMD::SCAtypeParameters>_> scData;
  shared_ptr<OpenMD::GenericData> data;
  shared_ptr<OpenMD::GenericData> local_68;
  undefined1 local_58 [16];
  string local_48;
  
  bVar4 = isSuttonChen(this);
  if (!bVar4) {
    AtomType::getName_abi_cxx11_(&local_48,this->at_);
    snprintf(painCave.errMsg,2000,
             "SuttonChenAdapter::getSuttonChenParam was passed an atomType (%s)\n\tthat does not appear to be a Sutton-Chen atom.\n"
             ,local_48._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_48);
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  AtomType::getPropertyByName((AtomType *)local_58,(string *)this->at_);
  if ((_func_int **)local_58._0_8_ == (_func_int **)0x0) {
    AtomType::getName_abi_cxx11_(&local_48,this->at_);
    snprintf(painCave.errMsg,2000,
             "SuttonChenAdapter::getSuttonChenParam could not find Sutton-Chen\n\tparameters for atomType %s.\n"
             ,local_48._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_48);
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  std::dynamic_pointer_cast<OpenMD::SimpleTypeData<OpenMD::SCAtypeParameters>,OpenMD::GenericData>
            (&local_68);
  if (local_68.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    AtomType::getName_abi_cxx11_(&local_48,this->at_);
    snprintf(painCave.errMsg,2000,
             "SuttonChenAdapter::getSuttonChenParam could not convert\n\tGenericData to SCAtypeData for atom type %s\n"
             ,local_48._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_48);
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  __return_storage_ptr__->epsilon =
       *(RealType *)
        ((long)&local_68.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                [1].id_.field_2 + 8);
  pp_Var1 = local_68.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
            _vptr_GenericData;
  pcVar2 = local_68.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
           id_._M_dataplus._M_p;
  RVar3 = (RealType)
          local_68.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].id_
          .field_2._M_allocated_capacity;
  __return_storage_ptr__->n =
       (RealType)
       local_68.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].id_.
       _M_string_length;
  __return_storage_ptr__->alpha = RVar3;
  __return_storage_ptr__->c = (RealType)pp_Var1;
  __return_storage_ptr__->m = (RealType)pcVar2;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_68.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8));
  return __return_storage_ptr__;
}

Assistant:

SCAtypeParameters SuttonChenAdapter::getSuttonChenParam() {
    if (!isSuttonChen()) {
      snprintf(
          painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
          "SuttonChenAdapter::getSuttonChenParam was passed an atomType (%s)\n"
          "\tthat does not appear to be a Sutton-Chen atom.\n",
          at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    std::shared_ptr<GenericData> data = at_->getPropertyByName(SCtypeID);
    if (data == nullptr) {
      snprintf(
          painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
          "SuttonChenAdapter::getSuttonChenParam could not find Sutton-Chen\n"
          "\tparameters for atomType %s.\n",
          at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    std::shared_ptr<SCAtypeData> scData =
        std::dynamic_pointer_cast<SCAtypeData>(data);
    if (scData == nullptr) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "SuttonChenAdapter::getSuttonChenParam could not convert\n"
               "\tGenericData to SCAtypeData for atom type %s\n",
               at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    return scData->getData();
  }